

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManReverseLevel(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar1 = p->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar11 = uVar1;
  }
  pVVar5->nCap = uVar11;
  if (uVar11 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar11 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 * 4);
  if (1 < (int)uVar1) {
    pGVar2 = p->pObjs;
    uVar10 = (ulong)uVar1 + 1;
    pGVar4 = pGVar2 + uVar1;
    do {
      pGVar6 = pGVar4 + -1;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return pVVar5;
      }
      uVar7 = uVar10 - 1;
      uVar13 = *(undefined8 *)pGVar6;
      uVar11 = (uint)uVar13;
      if ((~uVar11 & 0x1fffffff) == 0 || (int)uVar11 < 0) goto LAB_00746089;
      if ((long)(int)uVar1 < (long)uVar7) goto LAB_00746137;
      iVar9 = __s[uVar10 - 2];
      puVar3 = p->pMuxes;
      if ((puVar3 == (uint *)0x0) || (puVar3[uVar10 - 2] == 0)) {
        uVar11 = uVar11 & 0x1fffffff;
        uVar12 = (uint)((ulong)uVar13 >> 0x20) & 0x1fffffff;
        if (uVar11 < uVar12) {
          uVar15 = (-uVar11 + uVar10) - 2;
          uVar11 = (uint)uVar15;
          if (((int)uVar11 < 0) || (uVar1 <= uVar11)) goto LAB_00746137;
          uVar15 = uVar15 & 0xffffffff;
          if (__s[uVar15] < iVar9 + 2) {
            __s[uVar15] = iVar9 + 2;
            uVar12 = *(uint *)&pGVar4[-1].field_0x4 & 0x1fffffff;
          }
          uVar15 = (uVar10 + -uVar12) - 2;
          uVar11 = (uint)uVar15;
          if (((int)uVar11 < 0) || (uVar1 <= uVar11)) goto LAB_00746137;
          uVar15 = uVar15 & 0xffffffff;
          goto LAB_0074607f;
        }
        uVar15 = (uVar10 + -uVar11) - 2;
        uVar14 = (uint)uVar15;
        if (uVar11 != 0x1fffffff && uVar11 == uVar12) {
          if (((int)uVar14 < 0) || (uVar1 <= uVar14)) goto LAB_00746137;
          uVar15 = uVar15 & 0xffffffff;
          if (iVar9 <= __s[uVar15]) goto LAB_00746089;
          goto LAB_00746085;
        }
        if (((int)uVar14 < 0) || (uVar1 <= uVar14)) goto LAB_00746137;
        if (__s[uVar15 & 0xffffffff] <= iVar9) {
          __s[uVar15 & 0xffffffff] = iVar9 + 1;
          uVar12 = *(uint *)&pGVar4[-1].field_0x4 & 0x1fffffff;
        }
        uVar10 = (uVar10 + -uVar12) - 2;
        uVar11 = (uint)uVar10;
        if (((int)uVar11 < 0) || (uVar1 <= uVar11)) goto LAB_00746137;
        uVar10 = uVar10 & 0xffffffff;
        if (__s[uVar10] <= iVar9) {
          __s[uVar10] = iVar9 + 1;
        }
      }
      else {
        uVar15 = (-(uVar11 & 0x1fffffff) + uVar10) - 2;
        uVar11 = (uint)uVar15;
        if (((int)uVar11 < 0) || (uVar1 <= uVar11)) {
LAB_00746137:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = iVar9 + 2;
        uVar15 = uVar15 & 0xffffffff;
        if (__s[uVar15] < iVar8) {
          __s[uVar15] = iVar8;
          uVar13 = *(undefined8 *)pGVar6;
        }
        uVar11 = ((int)uVar10 - ((uint)((ulong)uVar13 >> 0x20) & 0x1fffffff)) - 2;
        if (uVar1 <= uVar11) goto LAB_00746137;
        if (__s[uVar11] < iVar8) {
          __s[uVar11] = iVar8;
        }
        uVar11 = puVar3[uVar10 - 2];
        if (uVar11 == 0) goto LAB_00746137;
        if ((int)uVar11 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar15 = (ulong)(uVar11 >> 1);
        if (uVar1 <= uVar11 >> 1) goto LAB_00746137;
LAB_0074607f:
        iVar9 = iVar9 + 2;
        if (__s[uVar15] < iVar9) {
LAB_00746085:
          __s[uVar15] = iVar9;
        }
      }
LAB_00746089:
      uVar10 = uVar7;
      pGVar4 = pGVar6;
    } while (2 < uVar7);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManReverseLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vLevelRev;
    Gia_Obj_t * pObj;
    int i;
    vLevelRev = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAndReverse( p, pObj, i )
    {
        int LevelR = Vec_IntEntry( vLevelRev, i );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId2(p, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsXor(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 2 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 2 );
        }
        else if ( Gia_ObjIsBuf(pObj) )
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR );
        }
        else
        {
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId0(pObj, i), LevelR + 1 );
            Vec_IntUpdateEntry( vLevelRev, Gia_ObjFaninId1(pObj, i), LevelR + 1 );
        }
    }
    return vLevelRev;
}